

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_rando_world_edits.hpp
# Opt level: O3

void PatchRandoWorldEdits::put_orcs_back_in_room_before_boss_swamp_shrine(World *world)

{
  mapped_type pMVar1;
  pointer pGVar2;
  pointer ppEVar3;
  mapped_type *ppMVar4;
  map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
  *this;
  undefined8 uVar5;
  EntityMaskFlag local_30;
  
  local_30.super_Flag._vptr_Flag._0_2_ = 0x1e;
  this = &world->_maps;
  ppMVar4 = std::
            map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
            ::at(this,(key_type *)&local_30);
  pMVar1 = *ppMVar4;
  pGVar2 = (pMVar1->_global_entity_mask_flags).
           super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pMVar1->_global_entity_mask_flags).
      super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
      super__Vector_impl_data._M_finish != pGVar2) {
    (pMVar1->_global_entity_mask_flags).
    super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
    super__Vector_impl_data._M_finish = pGVar2;
  }
  local_30.super_Flag._vptr_Flag._0_2_ = 0x1e;
  ppMVar4 = std::
            map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
            ::at(this,(key_type *)&local_30);
  Map::remove_entity(*ppMVar4,'\x05',true);
  local_30.super_Flag._vptr_Flag = (_func_int **)CONCAT62(local_30.super_Flag._vptr_Flag._2_6_,0x1e)
  ;
  ppMVar4 = std::
            map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
            ::at(this,(key_type *)&local_30);
  ppEVar3 = ((*ppMVar4)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((ulong)((long)((*ppMVar4)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar3 >> 3) < 2) {
    uVar5 = 1;
  }
  else {
    local_30.super_Flag.byte = 2;
    local_30.super_Flag.bit = '\x05';
    local_30.super_Flag._11_1_ = 0;
    local_30.super_Flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262e58;
    std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::emplace_back<EntityMaskFlag>
              (&(ppEVar3[1]->_attrs).mask_flags,&local_30);
    local_30.super_Flag._vptr_Flag =
         (_func_int **)CONCAT62(local_30.super_Flag._vptr_Flag._2_6_,0x1e);
    ppMVar4 = std::
              map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
              ::at(this,(key_type *)&local_30);
    ppEVar3 = ((*ppMVar4)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (2 < (ulong)((long)((*ppMVar4)->_entities).
                          super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)ppEVar3 >> 3)) {
      local_30.super_Flag.byte = 2;
      local_30.super_Flag.bit = '\x05';
      local_30.super_Flag._11_1_ = 0;
      local_30.super_Flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262e58;
      std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::emplace_back<EntityMaskFlag>
                (&(ppEVar3[2]->_attrs).mask_flags,&local_30);
      return;
    }
    uVar5 = 2;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5);
}

Assistant:

static void put_orcs_back_in_room_before_boss_swamp_shrine(World& world)
    {
        // In map before boss, put the orcs back and only remove the locked door
        world.map(MAP_SWAMP_SHRINE_ROOM_BEFORE_BOSS)->global_entity_mask_flags().clear();
        world.map(MAP_SWAMP_SHRINE_ROOM_BEFORE_BOSS)->remove_entity(5);
        // Remove the door orcs if Fara has been freed
        world.map(MAP_SWAMP_SHRINE_ROOM_BEFORE_BOSS)->entity(1)->mask_flags().emplace_back(EntityMaskFlag(false, 2, 5));
        world.map(MAP_SWAMP_SHRINE_ROOM_BEFORE_BOSS)->entity(2)->mask_flags().emplace_back(EntityMaskFlag(false, 2, 5));
    }